

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_00;
  int idx;
  long lVar1;
  
  if ((sms_tree != (SIMPLE_MOTION_DATA_TREE *)0x0) &&
     (sms_tree->partitioning = '\0', BLOCK_8X4 < bsize)) {
    bsize_00 = get_partition_subsize(bsize,bsize);
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      av1_reset_simple_motion_tree_partition(sms_tree->split[lVar1],bsize_00);
    }
  }
  return;
}

Assistant:

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,
                                            BLOCK_SIZE bsize) {
  if (sms_tree == NULL) return;
  sms_tree->partitioning = PARTITION_NONE;

  if (bsize >= BLOCK_8X8) {
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int idx = 0; idx < 4; ++idx)
      av1_reset_simple_motion_tree_partition(sms_tree->split[idx], subsize);
  }
}